

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arguments.hh
# Opt level: O3

void Arguments::assign_argument(string *key,string *value)

{
  char *pcVar1;
  int iVar2;
  int iVar3;
  int *piVar4;
  long lVar5;
  unsigned_long uVar6;
  time_t tVar7;
  undefined8 extraout_RAX;
  float fVar8;
  string extension;
  undefined1 local_80 [32];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_60;
  undefined1 local_50 [16];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  
  iVar2 = std::__cxx11::string::compare((char *)key);
  if (iVar2 == 0) {
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_80,
                   &MAZE_FOLDER_abi_cxx11_,value);
    std::__cxx11::string::operator=((string *)&maze_path_abi_cxx11_,(string *)local_80);
    if ((string *)local_80._0_8_ == (string *)(local_80 + 0x10)) {
      return;
    }
LAB_00105a0b:
    operator_delete((void *)local_80._0_8_);
    return;
  }
  iVar2 = std::__cxx11::string::compare((char *)key);
  if (iVar2 == 0) {
    value = (string *)(value->_M_dataplus)._M_p;
    piVar4 = __errno_location();
    iVar2 = *piVar4;
    *piVar4 = 0;
    fVar8 = strtof((char *)value,(char **)local_80);
    if ((string *)local_80._0_8_ == value) {
      std::__throw_invalid_argument("stof");
LAB_00105f25:
      n_games_test = std::__cxx11::stoi(value,(size_t *)0x0,10);
      return;
    }
    if (*piVar4 == 0) goto LAB_00105a9d;
    if (*piVar4 != 0x22) {
      ghost_speed = fVar8;
      return;
    }
    std::__throw_out_of_range("stof");
  }
  else {
    iVar2 = std::__cxx11::string::compare((char *)key);
    if (iVar2 != 0) {
      iVar2 = std::__cxx11::string::compare((char *)key);
      if (iVar2 == 0) {
        value = (string *)(value->_M_dataplus)._M_p;
        piVar4 = __errno_location();
        iVar2 = *piVar4;
        *piVar4 = 0;
        fVar8 = strtof((char *)value,(char **)local_80);
        if ((string *)local_80._0_8_ == value) {
          std::__throw_invalid_argument("stof");
LAB_00105f6a:
          visualization_speed = std::__cxx11::stod(value,(size_t *)0x0);
          return;
        }
        if (*piVar4 == 0) {
          *piVar4 = iVar2;
          ghost_afraid_speed_fraction = fVar8;
          return;
        }
        if (*piVar4 != 0x22) {
          ghost_afraid_speed_fraction = fVar8;
          return;
        }
        fVar8 = (float)std::__throw_out_of_range("stof");
        goto LAB_00105af1;
      }
      iVar2 = std::__cxx11::string::compare((char *)key);
      if (iVar2 == 0) {
        value = (string *)(value->_M_dataplus)._M_p;
        piVar4 = __errno_location();
        iVar2 = *piVar4;
        *piVar4 = 0;
        lVar5 = strtol((char *)value,(char **)local_80,10);
        if ((string *)local_80._0_8_ == value) {
          std::__throw_invalid_argument("stoi");
        }
        else {
          iVar3 = (int)lVar5;
          if ((iVar3 == lVar5) && (*piVar4 != 0x22)) {
            if (*piVar4 != 0) {
              n_rounds_powerpill = iVar3;
              return;
            }
            *piVar4 = iVar2;
            n_rounds_powerpill = iVar3;
            return;
          }
        }
        std::__throw_out_of_range("stoi");
LAB_00105f99:
        test_statistics_precision = std::__cxx11::stoi(value,(size_t *)0x0,10);
        return;
      }
      iVar2 = std::__cxx11::string::compare((char *)key);
      if (iVar2 == 0) {
        n_rounds_ghost_revive = std::__cxx11::stoi(value,(size_t *)0x0,10);
        return;
      }
      iVar2 = std::__cxx11::string::compare((char *)key);
      if (iVar2 == 0) {
        scatter_cycle_factor = std::__cxx11::stof(value,(size_t *)0x0);
        return;
      }
      iVar2 = std::__cxx11::string::compare((char *)key);
      if (iVar2 == 0) {
        chase_cycle_factor = std::__cxx11::stof(value,(size_t *)0x0);
        return;
      }
      iVar2 = std::__cxx11::string::compare((char *)key);
      if (iVar2 == 0) {
        initial_scatter_cycle_rounds = std::__cxx11::stoi(value,(size_t *)0x0,10);
        return;
      }
      iVar2 = std::__cxx11::string::compare((char *)key);
      if (iVar2 == 0) {
        initial_chase_cycle_rounds = std::__cxx11::stoi(value,(size_t *)0x0,10);
        return;
      }
      iVar2 = std::__cxx11::string::compare((char *)key);
      if (iVar2 == 0) {
        cycle_rounds_stdev = std::__cxx11::stof(value,(size_t *)0x0);
        return;
      }
      iVar2 = std::__cxx11::string::compare((char *)key);
      if (iVar2 == 0) {
        n_rounds_between_ghosts_start = std::__cxx11::stoi(value,(size_t *)0x0,10);
        return;
      }
      iVar2 = std::__cxx11::string::compare((char *)key);
      if (iVar2 == 0) {
        iVar2 = std::__cxx11::string::compare((char *)value);
        if (iVar2 == 0) {
          pacman_ai_agent = PATHFINDING;
          return;
        }
        iVar2 = std::__cxx11::string::compare((char *)value);
        if (iVar2 == 0) {
          pacman_ai_agent = INPUT;
          return;
        }
        iVar2 = std::__cxx11::string::compare((char *)value);
        if (iVar2 == 0) {
          pacman_ai_agent = RANDOM;
          return;
        }
        iVar2 = std::__cxx11::string::compare((char *)value);
        if (iVar2 == 0) {
          pacman_ai_agent = RL;
          return;
        }
        pcVar1 = (value->_M_dataplus)._M_p;
        if ((*pcVar1 == 'n') && (pcVar1[1] == 'n')) {
          pacman_ai_agent = NN;
          local_80._0_8_ = (string *)(local_80 + 0x10);
          std::__cxx11::string::_M_construct<char_const*>((string *)local_80,".txt","");
          std::operator+(&local_40,"../data/neural-networks/",value);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &local_60,&local_40,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_80);
          std::__cxx11::string::operator=
                    ((string *)&neural_network_path_abi_cxx11_,(string *)local_60._M_local_buf);
          if ((undefined1 *)local_60._M_allocated_capacity != local_50) {
            operator_delete((void *)local_60._M_allocated_capacity);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_40._M_dataplus._M_p != &local_40.field_2) {
            operator_delete(local_40._M_dataplus._M_p);
          }
          if ((string *)local_80._0_8_ == (string *)(local_80 + 0x10)) {
            return;
          }
          goto LAB_00105a0b;
        }
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &local_60,"Invalid pacman AI agent name \'",value);
        std::__cxx11::string::append(local_60._M_local_buf);
        assign_argument();
LAB_0010619d:
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &local_60,"Invalid neural network evaluation attribute name \'",value);
        std::__cxx11::string::append(local_60._M_local_buf);
        assign_argument();
LAB_001061d0:
        key = (string *)&local_60;
        std::operator+(key,"Invalid exploration strategy attribute name \'",value);
        std::__cxx11::string::append((char *)key);
        assign_argument();
      }
      else {
        iVar2 = std::__cxx11::string::compare((char *)key);
        if (iVar2 == 0) {
          plays = std::__cxx11::stoi(value,(size_t *)0x0,10);
          return;
        }
        iVar2 = std::__cxx11::string::compare((char *)key);
        if (iVar2 == 0) {
          iVar2 = std::__cxx11::string::compare((char *)value);
          if (iVar2 != 0) {
            uVar6 = std::__cxx11::stoul(value,(size_t *)0x0,10);
            random_seed = (uint)uVar6;
            return;
          }
          tVar7 = time((time_t *)0x0);
          random_seed = (uint)tVar7;
          return;
        }
        iVar2 = std::__cxx11::string::compare((char *)key);
        if (iVar2 == 0) {
          n_hidden_layers = std::__cxx11::stoi(value,(size_t *)0x0,10);
          return;
        }
        iVar2 = std::__cxx11::string::compare((char *)key);
        if (iVar2 == 0) {
          n_hidden_neurons = std::__cxx11::stoi(value,(size_t *)0x0,10);
          return;
        }
        iVar2 = std::__cxx11::string::compare((char *)key);
        if (iVar2 == 0) {
          learning_rate = std::__cxx11::stod(value,(size_t *)0x0);
          return;
        }
        iVar2 = std::__cxx11::string::compare((char *)key);
        if (iVar2 == 0) {
          reward_pill = std::__cxx11::stod(value,(size_t *)0x0);
          return;
        }
        iVar2 = std::__cxx11::string::compare((char *)key);
        if (iVar2 == 0) {
          reward_powerpill = std::__cxx11::stod(value,(size_t *)0x0);
          return;
        }
        iVar2 = std::__cxx11::string::compare((char *)key);
        if (iVar2 == 0) {
          reward_kill_ghost = std::__cxx11::stod(value,(size_t *)0x0);
          return;
        }
        iVar2 = std::__cxx11::string::compare((char *)key);
        if (iVar2 == 0) {
          reward_win = std::__cxx11::stod(value,(size_t *)0x0);
          return;
        }
        iVar2 = std::__cxx11::string::compare((char *)key);
        if (iVar2 == 0) {
          reward_lose = std::__cxx11::stod(value,(size_t *)0x0);
          return;
        }
        iVar2 = std::__cxx11::string::compare((char *)key);
        if (iVar2 == 0) {
          reward_reverse = std::__cxx11::stod(value,(size_t *)0x0);
          return;
        }
        iVar2 = std::__cxx11::string::compare((char *)key);
        if (iVar2 == 0) {
          reward_step = std::__cxx11::stod(value,(size_t *)0x0);
          return;
        }
        iVar2 = std::__cxx11::string::compare((char *)key);
        if (iVar2 == 0) {
          discount_factor = std::__cxx11::stod(value,(size_t *)0x0);
          return;
        }
        iVar2 = std::__cxx11::string::compare((char *)key);
        if (iVar2 == 0) {
          smart_exploration = stob(value);
          return;
        }
        iVar2 = std::__cxx11::string::compare((char *)key);
        if (iVar2 == 0) {
          safe_distance_margin = std::__cxx11::stoi(value,(size_t *)0x0,10);
          return;
        }
        iVar2 = std::__cxx11::string::compare((char *)key);
        if (iVar2 == 0) {
          max_intersection_distance = std::__cxx11::stoi(value,(size_t *)0x0,10);
          return;
        }
        iVar2 = std::__cxx11::string::compare((char *)key);
        if (iVar2 == 0) {
          logging_statistics_precision = std::__cxx11::stoi(value,(size_t *)0x0,10);
          return;
        }
        iVar2 = std::__cxx11::string::compare((char *)key);
        if (iVar2 == 0) {
          logging_update_rate = std::__cxx11::stoi(value,(size_t *)0x0,10);
          return;
        }
        iVar2 = std::__cxx11::string::compare((char *)key);
        if (iVar2 == 0) goto LAB_00105f25;
        iVar2 = std::__cxx11::string::compare((char *)key);
        if (iVar2 == 0) goto LAB_00105f4b;
        iVar2 = std::__cxx11::string::compare((char *)key);
        if (iVar2 == 0) goto LAB_00105f6a;
        iVar2 = std::__cxx11::string::compare((char *)key);
        if (iVar2 == 0) goto LAB_00105f99;
        iVar2 = std::__cxx11::string::compare((char *)key);
        if (iVar2 == 0) {
          non_interactive = stob(value);
          return;
        }
        iVar2 = std::__cxx11::string::compare((char *)key);
        if (iVar2 == 0) {
          nn_evaluation_start = std::__cxx11::stod(value,(size_t *)0x0);
          return;
        }
        iVar2 = std::__cxx11::string::compare((char *)key);
        if (iVar2 == 0) {
          iVar2 = std::__cxx11::string::compare((char *)value);
          if (iVar2 == 0) {
            nn_evaluation_attribute = WINS;
            return;
          }
          iVar2 = std::__cxx11::string::compare((char *)value);
          if (iVar2 == 0) {
            nn_evaluation_attribute = COMPLETION;
            return;
          }
          goto LAB_0010619d;
        }
        iVar2 = std::__cxx11::string::compare((char *)key);
        if (iVar2 == 0) {
          std::__cxx11::string::substr((ulong)local_80,(ulong)value);
          iVar2 = std::__cxx11::string::compare(local_80);
          if ((string *)local_80._0_8_ != (string *)(local_80 + 0x10)) {
            operator_delete((void *)local_80._0_8_);
          }
          if (iVar2 == 0) {
            exploration_strategy = ANNEALING;
            return;
          }
          std::__cxx11::string::substr((ulong)local_80,(ulong)value);
          iVar2 = std::__cxx11::string::compare(local_80);
          if ((string *)local_80._0_8_ != (string *)(local_80 + 0x10)) {
            operator_delete((void *)local_80._0_8_);
          }
          if (iVar2 == 0) {
            exploration_strategy = EPSILON;
            return;
          }
          goto LAB_001061d0;
        }
        iVar2 = std::__cxx11::string::compare((char *)key);
        if (iVar2 == 0) {
          exploration_annealing_min_progression = std::__cxx11::stod(value,(size_t *)0x0);
          return;
        }
        iVar2 = std::__cxx11::string::compare((char *)key);
        if (iVar2 == 0) {
          exploration_annealing_max_progression = std::__cxx11::stod(value,(size_t *)0x0);
          return;
        }
        iVar2 = std::__cxx11::string::compare((char *)key);
        if (iVar2 == 0) {
          exploration_epsilon = std::__cxx11::stod(value,(size_t *)0x0);
          return;
        }
        iVar2 = std::__cxx11::string::compare((char *)key);
        if (iVar2 == 0) {
          exploration_epsilon_stop_progression = std::__cxx11::stod(value,(size_t *)0x0);
          return;
        }
        iVar2 = std::__cxx11::string::compare((char *)key);
        if (iVar2 == 0) {
          iVar2 = std::__cxx11::string::compare((char *)value);
          if (iVar2 == 0) {
            activation_function = SIGMOID;
            return;
          }
          iVar2 = std::__cxx11::string::compare((char *)value);
          if (iVar2 == 0) {
            activation_function = RELU;
            return;
          }
          goto LAB_00106236;
        }
        iVar2 = std::__cxx11::string::compare((char *)key);
        if (iVar2 == 0) {
          test_sampling = std::__cxx11::stoi(value,(size_t *)0x0,10);
          return;
        }
      }
      value = (string *)&local_60;
      std::operator+(value,"Invalid argument name \'",key);
      std::__cxx11::string::append((char *)value);
      assign_argument();
LAB_00106236:
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_60,
                     "Invalid activation function name \'",value);
      std::__cxx11::string::append(local_60._M_local_buf);
      assign_argument();
      if ((undefined1 *)local_60._M_allocated_capacity != local_50) {
        operator_delete((void *)local_60._M_allocated_capacity);
      }
      _Unwind_Resume(extraout_RAX);
    }
  }
  value = (string *)(value->_M_dataplus)._M_p;
  piVar4 = __errno_location();
  iVar2 = *piVar4;
  *piVar4 = 0;
  fVar8 = strtof((char *)value,(char **)local_80);
  if ((string *)local_80._0_8_ == value) {
    std::__throw_invalid_argument("stof");
LAB_00105f4b:
    show_inputs = stob(value);
    return;
  }
  if (*piVar4 != 0) {
    if (*piVar4 != 0x22) {
      pacman_speed = fVar8;
      return;
    }
    fVar8 = (float)std::__throw_out_of_range("stof");
LAB_00105a9d:
    *piVar4 = iVar2;
    ghost_speed = fVar8;
    return;
  }
LAB_00105af1:
  *piVar4 = iVar2;
  pacman_speed = fVar8;
  return;
}

Assistant:

void Arguments::assign_argument(const string& key, const string& value) {
    if (key == "maze") Arguments::maze_path = MAZE_FOLDER + value;
    else if (key == "ghost_speed") Arguments::ghost_speed = stof(value);
    else if (key == "pacman_speed") Arguments::pacman_speed = stof(value);
    else if (key == "ghost_afraid_speed_fraction") Arguments::ghost_afraid_speed_fraction = stof(value);
    else if (key == "n_rounds_powerpill") Arguments::n_rounds_powerpill = stoi(value);
    else if (key == "n_rounds_ghost_revive") Arguments::n_rounds_ghost_revive = stoi(value);
    else if (key == "scatter_cycle_factor") Arguments::scatter_cycle_factor = stof(value);
    else if (key == "chase_cycle_factor") Arguments::chase_cycle_factor = stof(value);
    else if (key == "initial_scatter_cycle_rounds") Arguments::initial_scatter_cycle_rounds = stoi(value);
    else if (key == "initial_chase_cycle_rounds") Arguments::initial_chase_cycle_rounds = stoi(value);
    else if (key == "cycle_rounds_stdev") Arguments::cycle_rounds_stdev = stof(value);
    else if (key == "n_rounds_between_ghosts_start") Arguments::n_rounds_between_ghosts_start = stoi(value);
    else if (key == "pacman_ai_agent") {
        if (value == "pathfinding") Arguments::pacman_ai_agent = PATHFINDING;
        else if (value == "input") Arguments::pacman_ai_agent = INPUT;
        else if (value == "random") Arguments::pacman_ai_agent = RANDOM;
        else if (value == "rl") Arguments::pacman_ai_agent = RL;
        else if (value[0] == value[1] and value[1] == 'n') {
            Arguments::pacman_ai_agent = NN;
            string extension = ".txt";
            Arguments::neural_network_path = "../data/neural-networks/" + value + extension;
        }
        else error("Invalid pacman AI agent name '" + value + "'");
    }
    else if (key == "plays") Arguments::plays = stoi(value);
    else if (key == "random_seed") {
        if (value == "time") Arguments::random_seed = time(0);
        else Arguments::random_seed = stoul(value);
    }
    else if (key == "n_hidden_layers") Arguments::n_hidden_layers = stoi(value);
    else if (key == "n_hidden_neurons") Arguments::n_hidden_neurons = stoi(value);
    else if (key == "learning_rate") Arguments::learning_rate = stod(value);
    else if (key == "reward_pill") reward_pill = stod(value);
    else if (key == "reward_powerpill") reward_powerpill = stod(value);
    else if (key == "reward_kill_ghost") reward_kill_ghost = stod(value);
    else if (key == "reward_win") reward_win = stod(value);
    else if (key == "reward_lose") reward_lose = stod(value);
    else if (key == "reward_reverse") reward_reverse = stod(value);
    else if (key == "reward_step") reward_step = stod(value);
    else if (key == "discount_factor") discount_factor = stod(value);
    else if (key == "smart_exploration") smart_exploration = stob(value);
    else if (key == "safe_distance_margin") safe_distance_margin = stoi(value);
    else if (key == "max_intersection_distance") max_intersection_distance = stoi(value);
    else if (key == "logging_statistics_precision") logging_statistics_precision = stoi(value);
    else if (key == "logging_update_rate") logging_update_rate = stoi(value);
    else if (key == "n_games_test") n_games_test = stoi(value);
    else if (key == "show_inputs") show_inputs = stob(value);
    else if (key == "visualization_speed") visualization_speed = stod(value);
    else if (key == "test_statistics_precision") test_statistics_precision = stoi(value);
    else if (key == "non_interactive") non_interactive = stob(value);
    else if (key == "nn_evaluation_start") nn_evaluation_start = stod(value);
    else if (key == "nn_evaluation_attribute") {
        if (value == "wins") nn_evaluation_attribute = WINS;
        else if (value == "completion") nn_evaluation_attribute = COMPLETION;
        else error("Invalid neural network evaluation attribute name '" + value + "'");
    }
    else if (key == "exploration_strategy") {
        if (value.substr(0, 9) == "annealing") exploration_strategy = ANNEALING;
        else if (value.substr(0, 7) == "epsilon") exploration_strategy = EPSILON;
        else error("Invalid exploration strategy attribute name '" + value + "'");
    }
    else if (key == "exploration_annealing_min_progression") exploration_annealing_min_progression = stod(value);
    else if (key == "exploration_annealing_max_progression") exploration_annealing_max_progression = stod(value);
    else if (key == "exploration_epsilon") exploration_epsilon = stod(value);
    else if (key == "exploration_epsilon_stop_progression") exploration_epsilon_stop_progression = stod(value);
    else if (key == "activation_function") {
        if (value == "sigmoid") activation_function = SIGMOID;
        else if (value == "relu") activation_function = RELU;
        else error("Invalid activation function name '" + value + "'");
    }
    else if (key == "test_sampling") test_sampling = stoi(value);
    else error("Invalid argument name '" + key + "'");
}